

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpcQueueHelper.cpp
# Opt level: O1

void __thiscall helics::ipc::OwnedQueue::~OwnedQueue(OwnedQueue *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  _Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false> __ptr_00;
  pointer *__ptr;
  
  if ((this->rqueue)._M_t.
      super___uniq_ptr_impl<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
      .
      super__Head_base<0UL,_boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_*,_false>
      ._M_head_impl !=
      (message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_> *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->connectionName)._M_dataplus._M_p);
  }
  if ((this->queue_state)._M_t.
      super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
      ._M_t.
      super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
      .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl !=
      (shared_memory_object *)0x0) {
    boost::interprocess::shared_memory_object::remove((this->stateName)._M_dataplus._M_p);
  }
  pcVar2 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->buffer).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  pcVar3 = (this->errorString)._M_dataplus._M_p;
  paVar1 = &(this->errorString).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->stateName)._M_dataplus._M_p;
  paVar1 = &(this->stateName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->connectionName)._M_dataplus._M_p;
  paVar1 = &(this->connectionName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->connectionNameOrig)._M_dataplus._M_p;
  paVar1 = &(this->connectionNameOrig).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  __ptr_00._M_head_impl =
       (this->queue_state)._M_t.
       super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
       ._M_t.
       super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
       .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (shared_memory_object *)0x0) {
    std::default_delete<boost::interprocess::shared_memory_object>::operator()
              ((default_delete<boost::interprocess::shared_memory_object> *)&this->queue_state,
               __ptr_00._M_head_impl);
  }
  (this->queue_state)._M_t.
  super___uniq_ptr_impl<boost::interprocess::shared_memory_object,_std::default_delete<boost::interprocess::shared_memory_object>_>
  ._M_t.
  super__Tuple_impl<0UL,_boost::interprocess::shared_memory_object_*,_std::default_delete<boost::interprocess::shared_memory_object>_>
  .super__Head_base<0UL,_boost::interprocess::shared_memory_object_*,_false>._M_head_impl =
       (shared_memory_object *)0x0;
  std::
  unique_ptr<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>,_std::default_delete<boost::interprocess::message_queue_t<boost::interprocess::offset_ptr<void,_long,_unsigned_long,_0UL>_>_>_>
  ::~unique_ptr(&this->rqueue);
  return;
}

Assistant:

OwnedQueue::~OwnedQueue()
    {
        if (rqueue) {
            ipc_queue::remove(connectionName.c_str());
        }
        if (queue_state) {
            ipc_state::remove(stateName.c_str());
        }
    }